

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

ParamsNode * __thiscall Parser::function_params(Parser *this)

{
  Token *pTVar1;
  pointer *pppPVar2;
  int iVar3;
  LexData *pLVar4;
  pointer puVar5;
  bool bVar6;
  ParamsNode *pPVar7;
  vector<ParamNode_*,_std::allocator<ParamNode_*>_> *this_00;
  ulong uVar8;
  ParamNode *pPVar9;
  pointer pTVar10;
  uint uVar11;
  ulong uVar12;
  iterator iVar13;
  ParamNode *local_50 [2];
  long local_40;
  
  pPVar7 = (ParamsNode *)operator_new(0x28);
  (pPVar7->super_Node).kind = ParamsNode;
  (pPVar7->super_Node)._vptr_Node = (_func_int **)&PTR__ParamsNode_00117bc8;
  (pPVar7->params).super__Vector_base<ParamNode_*,_std::allocator<ParamNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pPVar7->params).super__Vector_base<ParamNode_*,_std::allocator<ParamNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pPVar7->params).super__Vector_base<ParamNode_*,_std::allocator<ParamNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  expect(this,'(');
  this_00 = &pPVar7->params;
  pTVar1 = &this->eof;
  do {
    while( true ) {
      iVar3 = this->tok_i;
      uVar11 = iVar3 + 1;
      this->tok_i = uVar11;
      pTVar10 = pTVar1;
      if (-2 < iVar3) {
        uVar8 = (ulong)uVar11;
        pTVar10 = (this->lex_data->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl
                  .super__Vector_impl_data._M_start;
        uVar12 = ((long)(this->lex_data->tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pTVar10 >> 2) *
                 -0x3333333333333333;
        pTVar10 = pTVar10 + uVar8;
        if (uVar12 < uVar8 || uVar12 - uVar8 == 0) {
          pTVar10 = pTVar1;
        }
      }
      this->tok = pTVar10;
      if (pTVar10->kind == Punctuator) {
        if (pTVar10->i == 0x29) {
          return pPVar7;
        }
      }
      else if (pTVar10->kind == Eof) {
        (*(pPVar7->super_Node)._vptr_Node[1])(pPVar7);
        return (ParamsNode *)0x0;
      }
      bVar6 = is_builtin_type(this);
      if (bVar6) break;
      error<char_const(&)[22]>(this,(char (*) [22])"expecting \')\' or type");
    }
    pPVar9 = (ParamNode *)operator_new(0x30);
    (pPVar9->super_Node).kind = ParamNode;
    (pPVar9->super_Node)._vptr_Node = (_func_int **)&PTR__ParamNode_00117c00;
    (pPVar9->name)._M_dataplus._M_p = (pointer)&(pPVar9->name).field_2;
    (pPVar9->name)._M_string_length = 0;
    (pPVar9->name).field_2._M_local_buf[0] = '\0';
    *(int *)&(pPVar9->super_Node).field_0xc = this->tok->i;
    iVar3 = this->tok_i;
    this->tok_i = iVar3 + 1U;
    pLVar4 = this->lex_data;
    pTVar10 = pTVar1;
    if (-2 < iVar3) {
      uVar8 = (ulong)(iVar3 + 1U);
      pTVar10 = (pLVar4->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar12 = ((long)(pLVar4->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pTVar10 >> 2) * -0x3333333333333333;
      pTVar10 = pTVar10 + uVar8;
      if (uVar12 < uVar8 || uVar12 - uVar8 == 0) {
        pTVar10 = pTVar1;
      }
    }
    uVar11 = iVar3 + 2;
    while( true ) {
      uVar8 = (ulong)uVar11;
      if (pTVar10->kind != Punctuator) break;
      iVar3 = pTVar10->i;
      if (iVar3 != 0x2a) {
        this->tok = pTVar10;
        if (iVar3 == 0x2c) goto LAB_0010f04e;
        if (iVar3 != 0x29) goto LAB_0010f03f;
        iVar13._M_current =
             (pPVar7->params).super__Vector_base<ParamNode_*,_std::allocator<ParamNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar13._M_current ==
            (pPVar7->params).super__Vector_base<ParamNode_*,_std::allocator<ParamNode_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_50[0] = pPVar9;
          std::vector<ParamNode*,std::allocator<ParamNode*>>::_M_realloc_insert<ParamNode*>
                    ((vector<ParamNode*,std::allocator<ParamNode*>> *)this_00,iVar13,local_50);
          return pPVar7;
        }
        goto LAB_0010f0ca;
      }
      this->tok_i = uVar11;
      pTVar10 = pTVar1;
      if ((-2 < (int)(uVar11 - 1)) &&
         (pTVar10 = (pLVar4->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                    super__Vector_impl_data._M_start,
         uVar12 = ((long)(pLVar4->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pTVar10 >> 2) *
                  -0x3333333333333333, pTVar10 = pTVar10 + uVar8,
         uVar12 < uVar8 || uVar12 - uVar8 == 0)) {
        pTVar10 = pTVar1;
      }
      uVar11 = uVar11 + 1;
    }
    if (pTVar10->kind == Identifier) {
      this->tok = pTVar10;
      puVar5 = (pLVar4->ids).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_50[0] = (ParamNode *)&local_40;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((string *)local_50,puVar5 + pTVar10->i,puVar5 + pTVar10->j);
      std::__cxx11::string::operator=((string *)&pPVar9->name,(string *)local_50);
      if (local_50[0] != (ParamNode *)&local_40) {
        operator_delete(local_50[0],local_40 + 1);
      }
      iVar3 = this->tok_i;
      uVar11 = iVar3 + 1;
      this->tok_i = uVar11;
      pTVar10 = pTVar1;
      if (-2 < iVar3) {
        uVar8 = (ulong)uVar11;
        pTVar10 = (this->lex_data->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl
                  .super__Vector_impl_data._M_start;
        uVar12 = ((long)(this->lex_data->tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pTVar10 >> 2) *
                 -0x3333333333333333;
        pTVar10 = pTVar10 + uVar8;
        if (uVar12 < uVar8 || uVar12 - uVar8 == 0) {
          pTVar10 = pTVar1;
        }
      }
      this->tok = pTVar10;
      if (pTVar10->kind == Punctuator) {
        if (pTVar10->i == 0x2c) goto LAB_0010f04e;
        if (pTVar10->i == 0x29) {
          iVar13._M_current =
               (pPVar7->params).super__Vector_base<ParamNode_*,_std::allocator<ParamNode_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar13._M_current ==
              (pPVar7->params).super__Vector_base<ParamNode_*,_std::allocator<ParamNode_*>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            local_50[0] = pPVar9;
            std::vector<ParamNode*,std::allocator<ParamNode*>>::_M_realloc_insert<ParamNode*>
                      ((vector<ParamNode*,std::allocator<ParamNode*>> *)this_00,iVar13,local_50);
            return pPVar7;
          }
LAB_0010f0ca:
          *iVar13._M_current = pPVar9;
          pppPVar2 = &(pPVar7->params).super__Vector_base<ParamNode_*,_std::allocator<ParamNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppPVar2 = *pppPVar2 + 1;
          return pPVar7;
        }
      }
      error<char_const(&)[38]>(this,(char (*) [38])"expecting \',\' or \')\' after param name");
    }
    else {
      this->tok = pTVar10;
LAB_0010f03f:
      error<char_const(&)[51]>
                (this,(char (*) [51])"expecting \',\', \')\', or param name after param type");
    }
LAB_0010f04e:
    iVar13._M_current =
         (pPVar7->params).super__Vector_base<ParamNode_*,_std::allocator<ParamNode_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar13._M_current ==
        (pPVar7->params).super__Vector_base<ParamNode_*,_std::allocator<ParamNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_50[0] = pPVar9;
      std::vector<ParamNode*,std::allocator<ParamNode*>>::_M_realloc_insert<ParamNode*>
                ((vector<ParamNode*,std::allocator<ParamNode*>> *)this_00,iVar13,local_50);
    }
    else {
      *iVar13._M_current = pPVar9;
      pppPVar2 = &(pPVar7->params).super__Vector_base<ParamNode_*,_std::allocator<ParamNode_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppPVar2 = *pppPVar2 + 1;
      local_50[0] = pPVar9;
    }
  } while( true );
}

Assistant:

ParamsNode* Parser::function_params()
{
  auto ps = std::make_unique<ParamsNode>();

  expect('(');
  while (next_token().kind != TokenKind::Eof) {
    if (is_punctuator(')')) {
      return ps.release();
    }
    else if (is_builtin_type()) {
      auto p = std::make_unique<ParamNode>();
      p->builtin_type = (Keyword)tok->i;

      next_token();

      // Pointers
      while (is_punctuator('*')) // TODO add this info to param type
        next_token();

      if (is(TokenKind::Identifier)) { // Param with name
        p->name = lex_data->id_text(*tok);

        next_token();
        if (is_punctuator(')')) {
          ps->params.push_back(p.get());
          p.release();
          return ps.release();
        }
        else if (!is_punctuator(','))
          error("expecting ',' or ')' after param name");
      }
      // Param without name
      else if (is_punctuator(')')) {
        ps->params.push_back(p.get());
        p.release();
        return ps.release();
      }
      else if (!is_punctuator(','))
        error("expecting ',', ')', or param name after param type");

      ps->params.push_back(p.get());
      p.release();
    }
    else {
      error("expecting ')' or type");
    }
  }

  return nullptr;
}